

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O3

void subtract_8x4(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  uint16_t *puVar1;
  int16_t *piVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  uint16_t uVar45;
  uint16_t uVar46;
  uint16_t uVar47;
  uint16_t uVar48;
  uint16_t uVar49;
  uint16_t uVar50;
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  
  uVar3 = src[1];
  uVar4 = src[2];
  uVar5 = src[3];
  uVar6 = src[4];
  uVar7 = src[5];
  uVar8 = src[6];
  uVar9 = src[7];
  puVar1 = src + src_stride;
  uVar10 = *puVar1;
  uVar11 = puVar1[1];
  uVar12 = puVar1[2];
  uVar13 = puVar1[3];
  uVar14 = puVar1[4];
  uVar15 = puVar1[5];
  uVar16 = puVar1[6];
  uVar17 = puVar1[7];
  puVar1 = src + src_stride * 2;
  uVar18 = *puVar1;
  uVar19 = puVar1[1];
  uVar20 = puVar1[2];
  uVar21 = puVar1[3];
  uVar22 = puVar1[4];
  uVar23 = puVar1[5];
  uVar24 = puVar1[6];
  uVar25 = puVar1[7];
  puVar1 = src + src_stride * 3;
  uVar26 = *puVar1;
  uVar27 = puVar1[1];
  uVar28 = puVar1[2];
  uVar29 = puVar1[3];
  uVar30 = puVar1[4];
  uVar31 = puVar1[5];
  uVar32 = puVar1[6];
  uVar33 = puVar1[7];
  uVar34 = pred[1];
  uVar35 = pred[2];
  uVar36 = pred[3];
  uVar37 = pred[4];
  uVar38 = pred[5];
  uVar39 = pred[6];
  uVar40 = pred[7];
  puVar1 = pred + pred_stride;
  uVar41 = *puVar1;
  uVar42 = puVar1[1];
  uVar43 = puVar1[2];
  uVar44 = puVar1[3];
  uVar45 = puVar1[4];
  uVar46 = puVar1[5];
  uVar47 = puVar1[6];
  uVar48 = puVar1[7];
  puVar1 = pred + pred_stride * 2;
  uVar49 = *puVar1;
  uVar50 = puVar1[1];
  uVar51 = puVar1[2];
  uVar52 = puVar1[3];
  uVar53 = puVar1[4];
  uVar54 = puVar1[5];
  uVar55 = puVar1[6];
  uVar56 = puVar1[7];
  puVar1 = pred + pred_stride * 3;
  uVar57 = *puVar1;
  uVar58 = puVar1[1];
  uVar59 = puVar1[2];
  uVar60 = puVar1[3];
  uVar61 = puVar1[4];
  uVar62 = puVar1[5];
  uVar63 = puVar1[6];
  uVar64 = puVar1[7];
  *diff = *src - *pred;
  diff[1] = uVar3 - uVar34;
  diff[2] = uVar4 - uVar35;
  diff[3] = uVar5 - uVar36;
  diff[4] = uVar6 - uVar37;
  diff[5] = uVar7 - uVar38;
  diff[6] = uVar8 - uVar39;
  diff[7] = uVar9 - uVar40;
  piVar2 = diff + diff_stride;
  *piVar2 = uVar10 - uVar41;
  piVar2[1] = uVar11 - uVar42;
  piVar2[2] = uVar12 - uVar43;
  piVar2[3] = uVar13 - uVar44;
  piVar2[4] = uVar14 - uVar45;
  piVar2[5] = uVar15 - uVar46;
  piVar2[6] = uVar16 - uVar47;
  piVar2[7] = uVar17 - uVar48;
  piVar2 = diff + diff_stride * 2;
  *piVar2 = uVar18 - uVar49;
  piVar2[1] = uVar19 - uVar50;
  piVar2[2] = uVar20 - uVar51;
  piVar2[3] = uVar21 - uVar52;
  piVar2[4] = uVar22 - uVar53;
  piVar2[5] = uVar23 - uVar54;
  piVar2[6] = uVar24 - uVar55;
  piVar2[7] = uVar25 - uVar56;
  piVar2 = diff + diff_stride * 3;
  *piVar2 = uVar26 - uVar57;
  piVar2[1] = uVar27 - uVar58;
  piVar2[2] = uVar28 - uVar59;
  piVar2[3] = uVar29 - uVar60;
  piVar2[4] = uVar30 - uVar61;
  piVar2[5] = uVar31 - uVar62;
  piVar2[6] = uVar32 - uVar63;
  piVar2[7] = uVar33 - uVar64;
  return;
}

Assistant:

static void subtract_8x4(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;
  __m128i x0, x1, x2, x3;

  u0 = _mm_loadu_si128((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadu_si128((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadu_si128((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadu_si128((__m128i const *)(src + 3 * src_stride));

  v0 = _mm_loadu_si128((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadu_si128((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadu_si128((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadu_si128((__m128i const *)(pred + 3 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);

  _mm_storeu_si128((__m128i *)(diff + 0 * diff_stride), x0);
  _mm_storeu_si128((__m128i *)(diff + 1 * diff_stride), x1);
  _mm_storeu_si128((__m128i *)(diff + 2 * diff_stride), x2);
  _mm_storeu_si128((__m128i *)(diff + 3 * diff_stride), x3);
}